

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O2

LogicalType * duckdb::GeoParquetFileMetadata::GeometryType(void)

{
  LogicalType *in_RDI;
  allocator local_31;
  string local_30;
  
  LogicalType::LogicalType(in_RDI,BLOB);
  ::std::__cxx11::string::string((string *)&local_30,"GEOMETRY",&local_31);
  LogicalType::SetAlias(in_RDI,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

LogicalType GeoParquetFileMetadata::GeometryType() {
	auto blob_type = LogicalType(LogicalTypeId::BLOB);
	blob_type.SetAlias("GEOMETRY");
	return blob_type;
}